

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_channel_id_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  int iVar1;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  if ((*(uint *)&hs->field_0x6c8 >> 0x18 & 1) == 0) {
    hs_local._7_1_ = true;
  }
  else {
    iVar1 = CBB_add_u16(out,0x7550);
    if ((iVar1 != 0) && (iVar1 = CBB_add_u16(out,0), iVar1 != 0)) {
      return true;
    }
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_channel_id_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  if (!hs->channel_id_negotiated) {
    return true;
  }

  if (!CBB_add_u16(out, TLSEXT_TYPE_channel_id) ||
      !CBB_add_u16(out, 0 /* length */)) {
    return false;
  }

  return true;
}